

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::InlinedStringIndex
          (ReflectionSchema *this,FieldDescriptor *field)

{
  FieldDescriptor **ppFVar1;
  
  if (this->inlined_string_donated_offset_ != -1) {
    if ((field->field_0x1 & 8) == 0) {
      ppFVar1 = &field->containing_type_->fields_;
    }
    else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
      ppFVar1 = &field->file_->extensions_;
    }
    else {
      ppFVar1 = &((field->scope_).extension_scope)->extensions_;
    }
    return this->inlined_string_indices_
           [(int)((ulong)((long)field - (long)*ppFVar1) >> 3) * -0x45d1745d];
  }
  InlinedStringIndex();
}

Assistant:

bool HasInlinedString() const { return inlined_string_donated_offset_ != -1; }